

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::QCborValue(QCborValue *this,QString *s)

{
  QStringView QVar1;
  QStringView in_stack_00000000;
  undefined8 local_20;
  
  QVar1 = qToStringViewIgnoringNull<QString,_true>(local_20);
  QCborValue((QCborValue *)QVar1.m_size,in_stack_00000000);
  return;
}

Assistant:

QCborValue::QCborValue(const QString &s) : QCborValue(qToStringViewIgnoringNull(s)) {}